

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * CreateConditionCast(ExpressionContext *ctx,SynBase *source,ExprBase *value)

{
  SynBase *ctx_00;
  bool bVar1;
  ExpressionContext *this;
  ExprBase *pEVar2;
  InplaceStr local_48;
  ExpressionContext *local_38;
  ExprBase *call;
  ExprBase *nullPtr;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  nullPtr = value;
  value_local = (ExprBase *)source;
  source_local = (SynBase *)ctx;
  bVar1 = isType<TypeError>(value->type);
  if (bVar1) {
    this = (ExpressionContext *)
           ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
    ExprTypeCast::ExprTypeCast
              ((ExprTypeCast *)this,(SynBase *)value_local,
               (TypeBase *)source_local[0x227]._vptr_SynBase,nullPtr,EXPR_CAST_REINTERPRET);
    ctx_local = this;
  }
  else {
    bVar1 = ExpressionContext::IsIntegerType((ExpressionContext *)source_local,nullPtr->type);
    if ((bVar1) || ((nullPtr->type->isGeneric & 1U) != 0)) {
      AssertValueExpression((ExpressionContext *)source_local,(SynBase *)value_local,nullPtr);
      if (nullPtr->type == (TypeBase *)source_local[0x227].pos.begin) {
        nullPtr = CreateCast((ExpressionContext *)source_local,(SynBase *)value_local,nullPtr,
                             (TypeBase *)source_local[0x227]._vptr_SynBase,false);
      }
      ctx_local = (ExpressionContext *)nullPtr;
    }
    else {
      bVar1 = ExpressionContext::IsFloatingPointType
                        ((ExpressionContext *)source_local,nullPtr->type);
      if (bVar1) {
        ctx_local = (ExpressionContext *)
                    CreateCast((ExpressionContext *)source_local,(SynBase *)value_local,nullPtr,
                               (TypeBase *)source_local[0x227]._vptr_SynBase,false);
      }
      else {
        bVar1 = isType<TypeRef>(nullPtr->type);
        if (bVar1) {
          ctx_local = (ExpressionContext *)
                      CreateCast((ExpressionContext *)source_local,(SynBase *)value_local,nullPtr,
                                 (TypeBase *)source_local[0x227]._vptr_SynBase,false);
        }
        else {
          bVar1 = isType<TypeUnsizedArray>(nullPtr->type);
          if (bVar1) {
            ctx_local = (ExpressionContext *)
                        CreateCast((ExpressionContext *)source_local,(SynBase *)value_local,nullPtr,
                                   (TypeBase *)source_local[0x227]._vptr_SynBase,false);
          }
          else {
            bVar1 = isType<TypeFunction>(nullPtr->type);
            ctx_00 = source_local;
            pEVar2 = value_local;
            if (bVar1) {
              ctx_local = (ExpressionContext *)
                          CreateCast((ExpressionContext *)source_local,(SynBase *)value_local,
                                     nullPtr,(TypeBase *)source_local[0x227]._vptr_SynBase,false);
            }
            else if (nullPtr->type == (TypeBase *)source_local[0x228].pos.begin) {
              pEVar2 = &ExpressionContext::get<ExprNullptrLiteral>
                                  ((ExpressionContext *)source_local)->super_ExprBase;
              ExprNullptrLiteral::ExprNullptrLiteral
                        ((ExprNullptrLiteral *)pEVar2,nullPtr->source,
                         *(TypeBase **)&source_local[0x228].typeID);
              call = pEVar2;
              ctx_local = (ExpressionContext *)
                          CreateBinaryOp((ExpressionContext *)source_local,(SynBase *)value_local,
                                         SYN_BINARY_OP_NOT_EQUAL,nullPtr,pEVar2);
            }
            else {
              InplaceStr::InplaceStr(&local_48,"bool");
              local_38 = (ExpressionContext *)
                         CreateFunctionCall1((ExpressionContext *)ctx_00,(SynBase *)pEVar2,local_48,
                                             nullPtr,true,false,false);
              ctx_local = local_38;
              if (local_38 == (ExpressionContext *)0x0) {
                ctx_local = (ExpressionContext *)
                            anon_unknown.dwarf_8df1c::ReportExpected
                                      ((ExpressionContext *)source_local,(SynBase *)value_local,
                                       (TypeBase *)source_local[0x227]._vptr_SynBase,
                                       "ERROR: condition type cannot be \'%.*s\' and function for conversion to bool is undefined"
                                       ,(ulong)(uint)((int)(nullPtr->type->name).end -
                                                     (int)(nullPtr->type->name).begin),
                                       (nullPtr->type->name).begin);
              }
            }
          }
        }
      }
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateConditionCast(ExpressionContext &ctx, SynBase *source, ExprBase *value)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.typeBool, value, EXPR_CAST_REINTERPRET);

	if(!ctx.IsIntegerType(value->type) && !value->type->isGeneric)
	{
		// TODO: function overload

		if(ctx.IsFloatingPointType(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeRef>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeUnsizedArray>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(isType<TypeFunction>(value->type))
			return CreateCast(ctx, source, value, ctx.typeBool, false);

		if(value->type == ctx.typeAutoRef)
		{
			ExprBase *nullPtr = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(value->source, ctx.typeNullPtr);

			return CreateBinaryOp(ctx, source, SYN_BINARY_OP_NOT_EQUAL, value, nullPtr);
		}
		else
		{
			if(ExprBase *call = CreateFunctionCall1(ctx, source, InplaceStr("bool"), value, true, false, false))
				return call;

			return ReportExpected(ctx, source, ctx.typeBool, "ERROR: condition type cannot be '%.*s' and function for conversion to bool is undefined", FMT_ISTR(value->type->name));
		}
	}

	AssertValueExpression(ctx, source, value);

	if(value->type == ctx.typeLong)
		value = CreateCast(ctx, source, value, ctx.typeBool, false);

	return value;
}